

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

Map<long,_long> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<long,_long>::MutableMap
          (TypeDefinedMapFieldBase<long,_long> *this)

{
  TypeDefinedMapFieldBase<long,_long> *this_local;
  
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<long,_long> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }